

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

AVisitor<hiberlite::LoadBean> * __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::operator&
          (AVisitor<hiberlite::LoadBean> *this,
          collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *nvp)

{
  LoadBean *this_00;
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_50;
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *local_18;
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *nvp_local;
  AVisitor<hiberlite::LoadBean> *this_local;
  
  this_00 = this->actor;
  local_18 = nvp;
  nvp_local = (collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               *)this;
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::collection_nvp(&local_50,nvp);
  LoadBean::
  act<hiberlite::AVisitor<hiberlite::LoadBean>,std::pair<int,int>,hiberlite::stl_stream_adapter<std::pair<int,int>,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (this_00,this,&local_50);
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~collection_nvp(&local_50);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(collection_nvp<E,S> nvp)
{
	actor->act(*this,nvp);
	return *this;
}